

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

WindowQuantileState<signed_char> * __thiscall
duckdb::QuantileState<signed_char,_duckdb::QuantileStandardType>::GetOrCreateWindowState
          (QuantileState<signed_char,_duckdb::QuantileStandardType> *this)

{
  bool bVar1;
  type pWVar2;
  unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>,_true>
  *in_RDI;
  unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>,_true>
  *in_stack_fffffffffffffff0;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>_>
                      *)0x9fc5ab);
  if (!bVar1) {
    make_uniq<duckdb::WindowQuantileState<signed_char>>();
    unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>,_true>
    ::operator=(in_stack_fffffffffffffff0,in_RDI);
    unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>,_true>
                   *)0x9fc5d5);
  }
  pWVar2 = unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>,_true>
           ::operator*(in_stack_fffffffffffffff0);
  return pWVar2;
}

Assistant:

WindowQuantileState<INPUT_TYPE> &GetOrCreateWindowState() {
		if (!window_state) {
			window_state = make_uniq<WindowQuantileState<INPUT_TYPE>>();
		}
		return *window_state;
	}